

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

int trim_finfo_highest(FINFO **fp,int highestp)

{
  FINFO *pFVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  FINFO *local_80;
  FINFO *lastp_2;
  FINFO *lastp_1;
  FINFO *lastp;
  char ver [16];
  int local_48;
  int linkp;
  int pnum;
  int num;
  FINFO *pp;
  FINFO *cp;
  FINFO *mp;
  FINFO *sp;
  FINFO *tp;
  int highestp_local;
  FINFO **fp_local;
  
  mp = *fp;
  _pnum = (FINFO *)0x0;
  local_48 = 0;
  linkp = 0;
  do {
    pp = mp;
    if (mp->dirp == 0) {
      if ((mp->next == (finfo *)0x0) ||
         (iVar2 = strcmp(mp->next->no_ver_name,mp->no_ver_name), iVar2 != 0)) {
        cp = mp;
      }
      else {
        cp = mp->next;
        pp = cp;
        while( true ) {
          bVar4 = false;
          if (pp->next != (finfo *)0x0) {
            iVar2 = strcmp(pp->next->no_ver_name,pp->no_ver_name);
            bVar4 = iVar2 == 0;
          }
          if (!bVar4) break;
          pp = pp->next;
        }
      }
      linkp = local_48;
      if (mp->version == 0) {
        if (pp == mp) {
          strcat(pp->lname,";1");
          pp->lname_len = pp->lname_len + 2;
          _pnum = pp;
          mp = pp->next;
        }
        else {
          bVar4 = false;
          sp = mp;
          do {
            sp = sp->next;
            if (sp->ino == mp->ino) {
              bVar4 = true;
              break;
            }
          } while (pp != sp);
          if (bVar4) {
            if (cp == pp) {
              mp->next = (finfo *)0x0;
            }
            else {
              mp->next = cp->next;
              cp->next = pp->next;
              pp->next = (finfo *)0x0;
            }
            for (lastp_2 = mp; lastp_2->next != (finfo *)0x0; lastp_2 = lastp_2->next) {
            }
            lastp_2->next = FreeFinfoList;
            FreeFinfoList = mp;
            if (_pnum == (FINFO *)0x0) {
              *fp = cp;
            }
            else {
              _pnum->next = cp;
            }
            _pnum = cp;
            mp = cp->next;
          }
          else {
            sprintf((char *)&lastp,";%u",(ulong)(cp->version + 1));
            strcat(mp->lname,(char *)&lastp);
            sVar3 = strlen(mp->lname);
            mp->lname_len = sVar3;
            mp->next = pp->next;
            pp->next = (finfo *)0x0;
            for (lastp_1 = cp; lastp_1->next != (finfo *)0x0; lastp_1 = lastp_1->next) {
            }
            lastp_1->next = FreeFinfoList;
            FreeFinfoList = cp;
            _pnum = mp;
            mp = mp->next;
          }
        }
      }
      else {
        if (pp != mp) {
          pFVar1 = mp->next;
          mp->next = pp->next;
          pp->next = (finfo *)0x0;
          for (local_80 = pFVar1; local_80->next != (finfo *)0x0; local_80 = local_80->next) {
          }
          local_80->next = FreeFinfoList;
          FreeFinfoList = pFVar1;
        }
        _pnum = mp;
        mp = mp->next;
      }
    }
    else {
      _pnum = mp;
      mp = mp->next;
    }
    linkp = linkp + 1;
    local_48 = local_48 + 1;
    if (mp == (FINFO *)0x0) {
      return linkp;
    }
  } while( true );
}

Assistant:

static int trim_finfo_highest(FINFO **fp, int highestp)
{
  FINFO *tp, *sp, *mp, *cp, *pp;
  int num, pnum;
  int linkp;
  char ver[VERSIONLEN];

  sp = mp = cp = *fp;
  pp = (FINFO *)NULL;
  num = pnum = 0;

  do {
    if (cp->dirp) {
      pp = cp;
      sp = cp = cp->next;
      pnum++;
      num++;
      continue;
    }

    if (cp->next != (FINFO *)NULL && strcmp(cp->next->no_ver_name, cp->no_ver_name) == 0) {
      mp = cp = cp->next;
      num++;
      while (cp->next != (FINFO *)NULL && strcmp(cp->next->no_ver_name, cp->no_ver_name) == 0) {
        cp = cp->next;
        num++;
      }
    } else {
      mp = cp;
    }

    if (sp->version == 0) {
      if (cp != sp) {
        /*
         * Both versionless and versioned files exists.
         */
        linkp = 0;
        tp = sp;
        do {
          tp = tp->next;
          if (tp->ino == sp->ino) {
            linkp = 1;
            break;
          }
        } while (cp != tp);

        if (!linkp) {
          /*
           * Versionless is not linked to any versioned
           * file.
           */
          sprintf(ver, ";%u", mp->version + 1);
          strcat(sp->lname, ver);
          sp->lname_len = strlen(sp->lname);
          /*
           * Lower versioned files, mp to cp
           * inclusive, should be removed.
           */
          sp->next = cp->next;
          cp->next = (FINFO *)NULL;
          FreeFinfo(mp);
          num = ++pnum;
          pp = sp;
          sp = cp = pp->next;
        } else {
          /*
           * Versionless is linked to one of versionless
           * files. We can remove it.
           */

          if (mp != cp) {
            sp->next = mp->next;
            mp->next = cp->next;
            cp->next = (FINFO *)NULL;
          } else {
            sp->next = (FINFO *)NULL;
          }
          FreeFinfo(sp);
          num = ++pnum;
          if (pp != (FINFO *)NULL)
            pp->next = mp;
          else
            *fp = mp;
          pp = mp;
          sp = cp = mp->next;
        }
      } else {
        /*
         * Only versionless file exists. It is regarded as
         * version 1.
         */
        strcat(cp->lname, ";1");
        cp->lname_len += 2;
        pp = cp;
        sp = cp = cp->next;
        num = ++pnum;
      }
    } else {
      if (cp != sp) {
        /*
         * All files are versioned.
         * Lower versioned files can be removed.
         */
        tp = sp->next;
        sp->next = cp->next;
        cp->next = (FINFO *)NULL;
        FreeFinfo(tp);
        num = ++pnum;
      } else {
        /*
         * A versioned file only exists.
         */
        num = ++pnum;
      }
      pp = sp;
      sp = cp = sp->next;
    }
  } while (sp != (FINFO *)NULL);

  return (num);
}